

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base.hpp
# Opt level: O1

FieldTuple * __thiscall
njoy::ENDFtk::record::Base<njoy::ENDFtk::record::Character<66>>::
readFields<_1,0,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Base<njoy::ENDFtk::record::Character<66>> *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  tools::disco::Record<njoy::tools::disco::Character<66u>,njoy::tools::disco::RetainCarriage>::
  read<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,std::__cxx11::string>
            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this,it,__return_storage_ptr__);
  return (FieldTuple *)__return_storage_ptr__;
}

Assistant:

static FieldTuple
    readFields( Iterator& it, const Iterator& end, std::false_type ){
      FieldTuple result;
      Format::read( it, end, std::get< Indices >( result )... );
      return result;
    }